

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

Vec_Int_t * Gia_RsbWindowInit(Gia_Man_t *p,Vec_Int_t *vPaths,int iPivot,int nIter)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  Vec_Int_t *vVisited;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iStart;
  int iNode;
  int iMeet;
  int local_44;
  Vec_Int_t *local_40;
  int local_38;
  uint local_34;
  
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  if ((iPivot < 0) || (p->nObjs <= iPivot)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar2 = p->pObjs;
  uVar7 = (uint)*(undefined8 *)(pGVar2 + (uint)iPivot);
  local_40 = pVVar5;
  local_38 = iPivot;
  if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x31a,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
  }
  iVar8 = 1;
  do {
    uVar3 = *(undefined8 *)(pGVar2 + (uint)iPivot);
    uVar7 = (uint)((ulong)uVar3 >> 0x20);
    if (iVar8 == 1) {
      uVar7 = (uint)uVar3;
    }
    Gia_ManIncrementTravId(p);
    iVar9 = local_38;
    Vec_IntPush(local_40,local_38 - (uVar7 & 0x1fffffff));
    uVar7 = iVar9 - (uVar7 & 0x1fffffff);
    if (((int)uVar7 < 0) || (vPaths->nSize <= (int)uVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    vPaths->pArray[uVar7] = 0;
    if (p->nTravIdsAlloc <= (int)uVar7) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
    }
    p->pTravIds[uVar7] = p->nTravIds;
    iVar8 = iVar8 + -1;
  } while (iVar8 == 0);
  pVVar5 = local_40;
  if (nIter < 1) {
    iVar8 = 0;
  }
  else {
    iVar9 = 0;
    iStart = 0;
    do {
      iVar8 = pVVar5->nSize;
      iVar4 = Gia_RsbWindowExplore(p,pVVar5,iStart,vPaths,(int *)&local_34,&local_44);
      vVisited = local_40;
      if (iVar4 != 0) {
        iVar8 = p->nTravIdsAlloc;
        if (iVar8 <= (int)local_34) {
LAB_007a55ba:
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
        }
        piVar6 = p->pTravIds;
        iVar1 = p->nTravIds;
        if (piVar6[(int)local_34] == iVar1) {
          if (iVar8 <= local_44) {
            __assert_fail("Id < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x269,"int Gia_ObjIsTravIdPreviousId(Gia_Man_t *, int)");
          }
          if (piVar6[local_44] != iVar1 + -1) {
            __assert_fail("Gia_ObjIsTravIdPreviousId(p, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x32c,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)")
            ;
          }
        }
        else {
          if (piVar6[(int)local_34] != iVar1 + -1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x32f,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)")
            ;
          }
          if (iVar8 <= local_44) goto LAB_007a55ba;
          if (piVar6[local_44] != iVar1) {
            __assert_fail("Gia_ObjIsTravIdCurrentId(p, iNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x32e,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)")
            ;
          }
        }
        local_40->nSize = 0;
        if (((int)local_34 < 0) || (vPaths->nSize <= (int)local_34)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Gia_RsbWindowGather(p,vPaths,vPaths->pArray[local_34],local_40);
        Gia_RsbWindowGather(p,vPaths,local_44,vVisited);
        Vec_IntPush(vVisited,local_38);
        pVVar5 = vVisited;
        iVar8 = iStart;
      }
      iStart = iVar8;
      iVar8 = iVar9;
    } while ((iVar4 == 0) && (iVar9 = iVar9 + 1, iVar8 = nIter, nIter != iVar9));
  }
  if (iVar8 == nIter) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (int *)0x0;
    }
    free(pVVar5);
    pVVar5 = (Vec_Int_t *)0x0;
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_RsbWindowInit( Gia_Man_t * p, Vec_Int_t * vPaths, int iPivot, int nIter )
{
    Vec_Int_t * vVisited = Vec_IntAlloc( 100 );
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot ); 
    int i, n, iStart = 0;
    assert( Gia_ObjIsAnd(pPivot) );
    // start paths for both fanins of the pivot node
    for ( n = 0; n < 2; n++ )
    {
        int iFan = Gia_ObjFaninId( pPivot, iPivot, n );
        Gia_ManIncrementTravId(p);
        Vec_IntPush( vVisited, iFan );
        Vec_IntWriteEntry( vPaths, iFan, 0 ); 
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    // perform several iterations of breadth-first search
    for ( i = 0; i < nIter; i++ )
    {
        int iMeet, iNode, iNext = Vec_IntSize(vVisited);
        if ( Gia_RsbWindowExplore( p, vVisited, iStart, vPaths, &iMeet, &iNode ) )
        {
            // found the shared path
            if ( Gia_ObjIsTravIdCurrentId(p, iMeet) )
                assert( Gia_ObjIsTravIdPreviousId(p, iNode) );
            else if ( Gia_ObjIsTravIdPreviousId(p, iMeet) )
                assert( Gia_ObjIsTravIdCurrentId(p, iNode) );
            else assert( 0 );
            // collect the initial window
            Vec_IntClear( vVisited );
            Gia_RsbWindowGather( p, vPaths, Vec_IntEntry(vPaths, iMeet), vVisited );
            Gia_RsbWindowGather( p, vPaths, iNode, vVisited );
            Vec_IntPush( vVisited, iPivot );
            break;
        }
        iStart = iNext;
    }
    // if no meeting point is found, make sure to return NULL
    if ( i == nIter )
        Vec_IntFreeP( &vVisited );
    return vVisited;
}